

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

uint64_t __thiscall
FIX::double_conversion::ReadUInt64
          (double_conversion *this,Vector<const_char> buffer,int from,int digits_to_read)

{
  uint64_t uVar1;
  uint uVar2;
  double_conversion *pdVar3;
  uint uVar4;
  
  if (from < 1) {
    uVar1 = 0;
  }
  else {
    uVar2 = buffer.length_;
    pdVar3 = this + uVar2;
    uVar1 = 0;
    uVar4 = uVar2;
    do {
      if (((int)uVar2 < 0) || ((int)buffer.start_ <= (int)uVar4)) {
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xcc,
                      "T &FIX::double_conversion::Vector<const char>::operator[](int) const [T = const char]"
                     );
      }
      if (9 < (byte)((char)*pdVar3 - 0x30U)) {
        __assert_fail("0 <= digit && digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                      ,0x5f,
                      "uint64_t FIX::double_conversion::ReadUInt64(Vector<const char>, int, int)");
      }
      uVar1 = (ulong)((byte)*pdVar3 & 0xf) + uVar1 * 10;
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + 1;
    } while ((int)uVar4 < (int)(from + uVar2));
  }
  return uVar1;
}

Assistant:

static uint64_t ReadUInt64(Vector<const char> buffer,
                           int from,
                           int digits_to_read) {
  uint64_t result = 0;
  for (int i = from; i < from + digits_to_read; ++i) {
    int digit = buffer[i] - '0';
    ASSERT(0 <= digit && digit <= 9);
    result = result * 10 + digit;
  }
  return result;
}